

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

bool server::serveroption(char *arg)

{
  char cVar1;
  int i;
  char *name;
  
  if (*arg != '-') {
    return false;
  }
  cVar1 = arg[1];
  if (cVar1 == 'y') {
    name = "serverpass";
  }
  else {
    if (cVar1 == 'o') {
      i = atoi(arg + 2);
      setvar("publicserver",i,true,true);
      return true;
    }
    if (cVar1 == 'p') {
      name = "adminpass";
    }
    else {
      if (cVar1 != 'n') {
        return false;
      }
      name = "serverdesc";
    }
  }
  setsvar(name,arg + 2,true);
  return true;
}

Assistant:

bool serveroption(const char *arg)
    {
        if(arg[0]=='-') switch(arg[1])
        {
            case 'n': setsvar("serverdesc", &arg[2]); return true;
            case 'y': setsvar("serverpass", &arg[2]); return true;
            case 'p': setsvar("adminpass", &arg[2]); return true;
            case 'o': setvar("publicserver", atoi(&arg[2])); return true;
        }
        return false;
    }